

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# epoll_reactor.hpp
# Opt level: O1

void __thiscall
asio::detail::epoll_reactor::
cancel_timer_by_key<asio::detail::chrono_time_traits<std::chrono::_V2::steady_clock,asio::wait_traits<std::chrono::_V2::steady_clock>>>
          (epoll_reactor *this,
          timer_queue<asio::detail::chrono_time_traits<std::chrono::_V2::steady_clock,_asio::wait_traits<std::chrono::_V2::steady_clock>_>_>
          *queue,per_timer_data *timer,void *cancellation_key)

{
  bool bVar1;
  op_queue<asio::detail::scheduler_operation> ops;
  op_queue<asio::detail::scheduler_operation> local_38;
  
  bVar1 = (this->mutex_).enabled_ == true;
  if (bVar1) {
    pthread_mutex_lock((pthread_mutex_t *)&(this->mutex_).mutex_);
  }
  local_38.front_ = (scheduler_operation *)0x0;
  local_38.back_ = (scheduler_operation *)0x0;
  timer_queue<asio::detail::chrono_time_traits<std::chrono::_V2::steady_clock,_asio::wait_traits<std::chrono::_V2::steady_clock>_>_>
  ::cancel_timer_by_key(queue,timer,&local_38,cancellation_key);
  if (bVar1) {
    if ((this->mutex_).enabled_ == true) {
      pthread_mutex_unlock((pthread_mutex_t *)&(this->mutex_).mutex_);
    }
    bVar1 = false;
  }
  scheduler::post_deferred_completions(this->scheduler_,&local_38);
  op_queue<asio::detail::scheduler_operation>::~op_queue(&local_38);
  if (bVar1) {
    pthread_mutex_unlock((pthread_mutex_t *)&(this->mutex_).mutex_);
  }
  return;
}

Assistant:

void epoll_reactor::cancel_timer_by_key(timer_queue<Time_Traits>& queue,
    typename timer_queue<Time_Traits>::per_timer_data* timer,
    void* cancellation_key)
{
  mutex::scoped_lock lock(mutex_);
  op_queue<operation> ops;
  queue.cancel_timer_by_key(timer, ops, cancellation_key);
  lock.unlock();
  scheduler_.post_deferred_completions(ops);
}